

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O0

void __thiscall
FListMenuItemStaticText::FListMenuItemStaticText
          (FListMenuItemStaticText *this,int x,int y,char *text,FFont *font,EColorRange color,
          bool centered)

{
  char *pcVar1;
  FName local_34;
  byte local_2d;
  EColorRange local_2c;
  bool centered_local;
  FFont *pFStack_28;
  EColorRange color_local;
  FFont *font_local;
  char *text_local;
  int y_local;
  int x_local;
  FListMenuItemStaticText *this_local;
  
  local_2d = centered;
  local_2c = color;
  pFStack_28 = font;
  font_local = (FFont *)text;
  text_local._0_4_ = y;
  text_local._4_4_ = x;
  _y_local = this;
  FName::FName(&local_34,NAME_None);
  FListMenuItem::FListMenuItem(&this->super_FListMenuItem,x,y,&local_34);
  (this->super_FListMenuItem)._vptr_FListMenuItem =
       (_func_int **)&PTR__FListMenuItemStaticText_009ed710;
  pcVar1 = ncopystring((char *)font_local);
  this->mText = pcVar1;
  this->mFont = pFStack_28;
  this->mColor = local_2c;
  this->mCentered = (bool)(local_2d & 1);
  return;
}

Assistant:

FListMenuItemStaticText::FListMenuItemStaticText(int x, int y, const char *text, FFont *font, EColorRange color, bool centered)
: FListMenuItem(x, y)
{
	mText = ncopystring(text);
	mFont = font;
	mColor = color;
	mCentered = centered;
}